

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::FirstChildElement(TiXmlHandle *this)

{
  long lVar1;
  TiXmlNode *pTVar2;
  long *in_RSI;
  long *plVar3;
  
  if (*in_RSI != 0) {
    for (plVar3 = *(long **)(*in_RSI + 0x28); plVar3 != (long *)0x0; plVar3 = (long *)plVar3[9]) {
      lVar1 = (**(code **)(*plVar3 + 0x28))(plVar3);
      if (lVar1 != 0) {
        pTVar2 = (TiXmlNode *)(**(code **)(*plVar3 + 0x28))(plVar3);
        if (pTVar2 != (TiXmlNode *)0x0) goto LAB_00170d34;
        break;
      }
    }
  }
  pTVar2 = (TiXmlNode *)0x0;
LAB_00170d34:
  this->node = pTVar2;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::FirstChildElement() const {
	if (node) {
		TiXmlElement* child = node->FirstChildElement();
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}